

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

int __thiscall
fmp4_stream::ingest_stream::write_init_to_file
          (ingest_stream *this,string *ofile,uint nfrags,bool write_sep_files)

{
  ostream *poVar1;
  undefined3 in_register_00000009;
  ulong index;
  uint uVar2;
  uint uVar3;
  uint i;
  long lVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> segment_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> init_data;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream out_file;
  int aiStack_210 [120];
  
  if (CONCAT31(in_register_00000009,write_sep_files) == 0) {
    std::ofstream::ofstream(&out_file,(string *)ofile,_S_bin);
    if (*(int *)((long)aiStack_210 + *(long *)(_out_file + -0x18)) == 0) {
      segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      get_init_segment_data(this,&segment_data);
      std::ostream::write((char *)&out_file,
                          (long)segment_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      for (index = 0; nfrags != index; index = index + 1) {
        if (index < (ulong)((*(long *)&this->field_0xd8 - *(long *)&this->media_fragment_) / 1000))
        {
          if (segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_finish !=
              segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start) {
            segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          get_media_segment_data(this,index,&segment_data);
          std::ostream::write((char *)&out_file,
                              (long)segment_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      std::ofstream::close();
      poVar1 = std::operator<<((ostream *)&std::cout," done written init segment to file: ");
      poVar1 = std::operator<<(poVar1,(string *)ofile);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cout," error writing stream to file ");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::ofstream::~ofstream(&out_file);
  }
  else {
    init_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    init_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    init_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    get_init_segment_data(this,&init_data);
    uVar2 = 0;
    for (uVar3 = 0; uVar3 < nfrags; uVar3 = uVar3 + 4) {
      std::__cxx11::to_string(&local_270,uVar3 >> 2);
      std::operator+(&local_250,&local_270,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &segment_data,&local_250,ofile);
      std::ofstream::ofstream(&out_file,(string *)&segment_data,_S_bin);
      std::__cxx11::string::~string((string *)&segment_data);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (*(int *)((long)aiStack_210 + *(long *)(_out_file + -0x18)) == 0) {
        std::ostream::write((char *)&out_file,
                            (long)init_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
          if (segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_finish !=
              segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start) {
            segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 segment_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          get_media_segment_data(this,(ulong)uVar2 + lVar4,&segment_data);
          std::ostream::write((char *)&out_file,
                              (long)segment_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        }
        std::ofstream::close();
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&segment_data);
      std::ofstream::~ofstream(&out_file);
      uVar2 = uVar2 + 0x10;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&init_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return 0;
}

Assistant:

int ingest_stream::write_init_to_file(
		std::string &ofile, 
		unsigned int nfrags, 
		bool write_sep_files)
	{
		// write the stream to an output file
		if (!write_sep_files) {
			std::ofstream out_file(ofile, std::ofstream::binary);

			if (out_file.good())
			{
				std::vector<uint8_t> init_data;
				get_init_segment_data(init_data);
				out_file.write((char *)init_data.data(), init_data.size());
				for (unsigned int k = 0; k < nfrags; k++) {
					if (k < media_fragment_.size()) {
						init_data.clear();
						get_media_segment_data(k, init_data);
						out_file.write((char *)init_data.data(), init_data.size());
					}
				}
				out_file.close();
				std::cout << " done written init segment to file: " << ofile << std::endl;
			}
			else
			{
				std::cout << " error writing stream to file " << std::endl;
			}
		}
		else 
		{
			std::vector<uint8_t> init_data;
			get_init_segment_data(init_data);
			const unsigned int chunk_count=4;
			for (unsigned int k = 0; k < nfrags; k+=chunk_count) 
			{
				std::ofstream out_file( std::to_string(k/chunk_count) + "_" + ofile, std::ofstream::binary);
				std::vector<uint8_t> segment_data;
				if (out_file.good())
				{
					out_file.write((char *)init_data.data(), init_data.size());
					for (unsigned int i = 0; i < chunk_count; i++) {
						segment_data.clear();
						get_media_segment_data(k*chunk_count + i, segment_data);
						out_file.write((char *)segment_data.data(), segment_data.size());
					}
					out_file.close();
				}
			}
		}
		return 0;
	}